

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O2

lattice_site __thiscall
sisl::body_centered_cubic<char>::get_nearest_site(body_centered_cubic<char> *this,vector *pt)

{
  Scalar *pSVar1;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *in_RDX;
  Index extraout_RDX;
  int i;
  long index;
  double dVar2;
  ReturnType RVar3;
  ReturnType RVar4;
  lattice_site lVar5;
  vector uvw;
  vector unit;
  vector xyz;
  vector ijk;
  vector v2;
  vector v1;
  Matrix<double,__1,_1,_0,__1,_1> local_100;
  Matrix<double,__1,_1,_0,__1,_1> local_f0;
  void *local_e0 [2];
  double local_d0;
  Matrix<double,__1,_1,_0,__1,_1> local_c8;
  Matrix<double,__1,_1,_0,__1,_1> local_b8;
  Matrix<double,__1,_1,_0,__1,_1> local_a8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_58;
  
  local_58._0_8_ = 0x3fe0000000000000;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_98,in_RDX,(double *)&local_58);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_e0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_98);
  local_98.m_lhs._0_4_ = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_f0,(int *)&local_98);
  local_98.m_lhs._0_4_ = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_c8,(int *)&local_98);
  local_98.m_lhs = (LhsNested)CONCAT44(local_98.m_lhs._4_4_,3);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_100,(int *)&local_98);
  local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_98.m_lhs = (LhsNested)local_e0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_e0,
             (ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98);
  local_98.m_lhs = (LhsNested)0x3ff0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_f0,(Scalar *)&local_98);
  local_d0 = 0.5;
  Eigen::operator*(&local_58,&local_d0,(StorageBaseType *)&local_f0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            (&local_98,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_e0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_58);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&local_c8,&local_98);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_98,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_e0,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_f0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (&local_100,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_98);
  for (index = 0; index != 3; index = index + 1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_c8,
                        index);
    dVar2 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_c8,
                        index);
    dVar2 = floor(dVar2);
    *pSVar1 = dVar2 + dVar2;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_100,
                        index);
    dVar2 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_100,
                        index);
    dVar2 = floor(dVar2);
    *pSVar1 = dVar2 + dVar2;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
            ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_100,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_f0);
  local_d0._0_4_ = 2;
  Eigen::operator*(&local_58,(int *)&local_d0,(StorageBaseType *)local_e0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_98,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_58);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&local_a8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_98);
  local_d0 = (double)CONCAT44(local_d0._4_4_,2);
  Eigen::operator*(&local_58,(int *)&local_d0,(StorageBaseType *)local_e0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_98,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_100,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_58);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&local_b8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_98);
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a8,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_a8);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_b8,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_b8);
  if (RVar4 <= RVar3) {
    local_98.m_lhs = (LhsNested)&local_100;
    Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<double,int>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)this,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<double,_int>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_98);
  }
  else {
    local_98.m_lhs = (LhsNested)&local_c8;
    Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<double,int>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)this,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<double,_int>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_98);
  }
  free(local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_e0[0]);
  lVar5.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = extraout_RDX;
  lVar5.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)this;
  return (lattice_site)lVar5.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual lattice_site get_nearest_site(const vector &pt) const {
             vector xyz = pt * 0.5;
             vector unit(3), ijk(3), uvw(3), v1, v2;

             xyz = xyz.array();
             
             unit.fill(1.);
             ijk = xyz + (0.5)*unit;
             uvw = xyz + unit;

             for(int i = 0; i < 3; i++) {
                 ijk[i] = 2*floor(ijk[i]);
                 uvw[i] = 2*floor(uvw[i]);
            }
            uvw -= unit;

            v1 = ijk - 2*xyz;
            v2 = uvw - 2*xyz;

            if(v1.dot(v1) < v2.dot(v2)) {
                return ijk.cast<int>();
            }
            return uvw.cast<int>();
        }